

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O3

opj_tgt_tree_t * opj_tgt_create(OPJ_UINT32 numleafsh,OPJ_UINT32 numleafsv,opj_event_mgr_t *manager)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  opj_tgt_node *poVar3;
  uint uVar4;
  opj_tgt_tree_t *ptr;
  opj_tgt_node_t *poVar5;
  OPJ_UINT32 *pOVar6;
  uint uVar7;
  char *fmt;
  opj_tgt_node *poVar8;
  OPJ_INT32 event_type;
  ulong uVar9;
  opj_tgt_node_t *poVar10;
  opj_tgt_node *poVar11;
  uint uVar12;
  OPJ_UINT32 OVar13;
  OPJ_INT32 nplv [32];
  OPJ_INT32 nplh [32];
  OPJ_UINT32 local_138 [32];
  OPJ_UINT32 local_b8 [34];
  
  ptr = (opj_tgt_tree_t *)opj_calloc(1,0x20);
  if (ptr == (opj_tgt_tree_t *)0x0) {
    fmt = "Not enough memory to create Tag-tree\n";
    event_type = 1;
  }
  else {
    ptr->numleafsh = numleafsh;
    ptr->numleafsv = numleafsv;
    uVar4 = 0;
    uVar12 = 0xffffffff;
    OVar13 = numleafsv;
    local_b8[0] = numleafsh;
    do {
      uVar7 = OVar13 * numleafsh;
      numleafsh = (int)((numleafsh - ((int)(numleafsh + 1) >> 0x1f)) + 1) >> 1;
      local_b8[uVar12 + 2] = numleafsh;
      OVar13 = (int)((OVar13 - ((int)(OVar13 + 1) >> 0x1f)) + 1) >> 1;
      local_138[uVar12 + 2] = OVar13;
      uVar4 = uVar4 + uVar7;
      uVar12 = uVar12 + 1;
    } while (1 < uVar7);
    ptr->numnodes = uVar4;
    local_138[0] = numleafsv;
    if (uVar4 != 0) {
      poVar5 = (opj_tgt_node_t *)opj_calloc((ulong)uVar4,0x18);
      ptr->nodes = poVar5;
      if (poVar5 == (opj_tgt_node_t *)0x0) {
        opj_event_msg(manager,1,"Not enough memory to create Tag-tree nodes\n");
        opj_free(ptr);
        return (opj_tgt_tree_t *)0x0;
      }
      OVar13 = ptr->numnodes;
      ptr->nodes_size = OVar13 * 0x18;
      poVar10 = poVar5;
      if (uVar12 != 0) {
        poVar8 = poVar5 + ptr->numleafsv * ptr->numleafsh;
        uVar9 = 0;
        poVar11 = poVar8;
        do {
          OVar1 = local_138[uVar9];
          if (0 < (int)OVar1) {
            OVar2 = local_b8[uVar9];
            uVar4 = 0;
            do {
              uVar7 = OVar2 + 2;
              if (0 < (int)OVar2) {
                do {
                  poVar10->parent = poVar11;
                  if (uVar7 == 3) {
                    poVar11 = poVar11 + 1;
                    poVar10 = poVar10 + 1;
                    break;
                  }
                  poVar10[1].parent = poVar11;
                  poVar10 = poVar10 + 2;
                  poVar11 = poVar11 + 1;
                  uVar7 = uVar7 - 2;
                } while (2 < uVar7);
              }
              poVar3 = poVar8 + (int)OVar2;
              if (uVar4 == OVar1 - 1 || (uVar4 & 1) != 0) {
                poVar3 = poVar11;
                poVar8 = poVar11;
              }
              poVar11 = poVar8;
              poVar8 = poVar3;
              uVar4 = uVar4 + 1;
            } while (uVar4 != OVar1);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar12);
      }
      poVar10->parent = (opj_tgt_node *)0x0;
      if (OVar13 == 0) {
        return ptr;
      }
      pOVar6 = &poVar5->known;
      do {
        *(undefined8 *)(pOVar6 + -2) = 999;
        *pOVar6 = 0;
        pOVar6 = pOVar6 + 6;
        OVar13 = OVar13 - 1;
      } while (OVar13 != 0);
      return ptr;
    }
    opj_free(ptr);
    fmt = "tgt_create tree->numnodes == 0, no tree created.\n";
    event_type = 2;
  }
  opj_event_msg(manager,event_type,fmt);
  return (opj_tgt_tree_t *)0x0;
}

Assistant:

opj_tgt_tree_t *opj_tgt_create(OPJ_UINT32 numleafsh, OPJ_UINT32 numleafsv, opj_event_mgr_t *manager) {
        OPJ_INT32 nplh[32];
        OPJ_INT32 nplv[32];
        opj_tgt_node_t *node = 00;
        opj_tgt_node_t *l_parent_node = 00;
        opj_tgt_node_t *l_parent_node0 = 00;
        opj_tgt_tree_t *tree = 00;
        OPJ_UINT32 i;
        OPJ_INT32  j,k;
        OPJ_UINT32 numlvls;
        OPJ_UINT32 n;

        tree = (opj_tgt_tree_t *) opj_calloc(1,sizeof(opj_tgt_tree_t));
        if(!tree) {
                opj_event_msg(manager, EVT_ERROR, "Not enough memory to create Tag-tree\n");
                return 00;
        }

        tree->numleafsh = numleafsh;
        tree->numleafsv = numleafsv;

        numlvls = 0;
        nplh[0] = (OPJ_INT32)numleafsh;
        nplv[0] = (OPJ_INT32)numleafsv;
        tree->numnodes = 0;
        do {
                n = (OPJ_UINT32)(nplh[numlvls] * nplv[numlvls]);
                nplh[numlvls + 1] = (nplh[numlvls] + 1) / 2;
                nplv[numlvls + 1] = (nplv[numlvls] + 1) / 2;
                tree->numnodes += n;
                ++numlvls;
        } while (n > 1);

        /* ADD */
        if (tree->numnodes == 0) {
                opj_free(tree);
                opj_event_msg(manager, EVT_WARNING, "tgt_create tree->numnodes == 0, no tree created.\n");
                return 00;
        }

        tree->nodes = (opj_tgt_node_t*) opj_calloc(tree->numnodes, sizeof(opj_tgt_node_t));
        if(!tree->nodes) {
                opj_event_msg(manager, EVT_ERROR, "Not enough memory to create Tag-tree nodes\n");
                opj_free(tree);
                return 00;
        }
        tree->nodes_size = tree->numnodes * (OPJ_UINT32)sizeof(opj_tgt_node_t);

        node = tree->nodes;
        l_parent_node = &tree->nodes[tree->numleafsh * tree->numleafsv];
        l_parent_node0 = l_parent_node;

        for (i = 0; i < numlvls - 1; ++i) {
                for (j = 0; j < nplv[i]; ++j) {
                        k = nplh[i];
                        while (--k >= 0) {
                                node->parent = l_parent_node;
                                ++node;
                                if (--k >= 0) {
                                        node->parent = l_parent_node;
                                        ++node;
                                }
                                ++l_parent_node;
                        }
                        if ((j & 1) || j == nplv[i] - 1) {
                                l_parent_node0 = l_parent_node;
                        } else {
                                l_parent_node = l_parent_node0;
                                l_parent_node0 += nplh[i];
                        }
                }
        }
        node->parent = 0;
        opj_tgt_reset(tree);
        return tree;
}